

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_packed_varyings.cpp
# Opt level: O0

uint __thiscall
anon_unknown.dwarf_114b1e::lower_packed_varyings_visitor::lower_rvalue
          (lower_packed_varyings_visitor *this,ir_rvalue *rvalue,uint fine_location,
          ir_variable *unpacked_var,char *name,bool gs_input_toplevel,uint vertex_index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ir_dereference_record *this_00;
  ir_swizzle *piVar4;
  ir_swizzle *this_01;
  undefined4 extraout_var_00;
  char *pcVar5;
  ir_rvalue *val;
  undefined4 extraout_var_01;
  bool local_f9;
  ir_swizzle *swizzle;
  uint i_4;
  ir_variable *packed_var;
  ir_dereference *packed_deref;
  uint i_3;
  uint location_frac;
  uint location;
  uint components;
  uint swizzle_values [4];
  char *right_name;
  char *left_name;
  ir_swizzle *right_swizzle;
  ir_swizzle *left_swizzle;
  uint i_2;
  uint i_1;
  char right_swizzle_name [4];
  char left_swizzle_name [4];
  uint right_swizzle_values [4];
  uint left_swizzle_values [4];
  uint right_components;
  uint left_components;
  char *deref_name;
  ir_dereference_record *dereference_record;
  char *field_name;
  uint i;
  uint dmul;
  bool gs_input_toplevel_local;
  char *name_local;
  ir_variable *unpacked_var_local;
  ir_rvalue *piStack_20;
  uint fine_location_local;
  ir_rvalue *rvalue_local;
  lower_packed_varyings_visitor *this_local;
  
  bVar1 = glsl_type::is_64bit(rvalue->type);
  iVar3 = 1;
  if (bVar1) {
    iVar3 = 2;
  }
  local_f9 = true;
  if (gs_input_toplevel) {
    local_f9 = glsl_type::is_array(rvalue->type);
  }
  if (local_f9 != false) {
    bVar1 = glsl_type::is_struct(rvalue->type);
    if (bVar1) {
      unpacked_var_local._4_4_ = fine_location;
      piStack_20 = rvalue;
      for (field_name._4_4_ = 0; field_name._4_4_ < piStack_20->type->length;
          field_name._4_4_ = field_name._4_4_ + 1) {
        if (field_name._4_4_ != 0) {
          iVar3 = (*(piStack_20->super_ir_instruction)._vptr_ir_instruction[4])
                            (piStack_20,this->mem_ctx,0);
          piStack_20 = (ir_rvalue *)CONCAT44(extraout_var,iVar3);
        }
        pcVar5 = *(char **)&(piStack_20->type->fields).array[field_name._4_4_].vector_elements;
        this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,this->mem_ctx);
        ir_dereference_record::ir_dereference_record(this_00,piStack_20,pcVar5);
        pcVar5 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,pcVar5);
        unpacked_var_local._4_4_ =
             lower_rvalue(this,(ir_rvalue *)this_00,unpacked_var_local._4_4_,unpacked_var,pcVar5,
                          false,vertex_index);
      }
      this_local._4_4_ = unpacked_var_local._4_4_;
    }
    else {
      bVar1 = glsl_type::is_array(rvalue->type);
      if (bVar1) {
        uVar2 = glsl_type::array_size(rvalue->type);
        this_local._4_4_ =
             lower_arraylike(this,rvalue,uVar2,fine_location,unpacked_var,name,gs_input_toplevel,
                             vertex_index);
      }
      else {
        bVar1 = glsl_type::is_matrix(rvalue->type);
        if (bVar1) {
          this_local._4_4_ =
               lower_arraylike(this,rvalue,(uint)rvalue->type->matrix_columns,fine_location,
                               unpacked_var,name,false,vertex_index);
        }
        else if ((uint)rvalue->type->vector_elements * iVar3 + (fine_location & 3) < 5) {
          memset(&location,0,0x10);
          uVar2 = (uint)rvalue->type->vector_elements * iVar3;
          for (packed_deref._0_4_ = 0; (uint)packed_deref < uVar2;
              packed_deref._0_4_ = (uint)packed_deref + 1) {
            (&location)[(uint)packed_deref] = (uint)packed_deref + (fine_location & 3);
          }
          val = &get_packed_varying_deref(this,fine_location >> 2,unpacked_var,name,vertex_index)->
                 super_ir_rvalue;
          if ((unpacked_var->data).stream != 0) {
            if (3 < (unpacked_var->data).stream) {
              __assert_fail("unpacked_var->data.stream < 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                            ,0x267,
                            "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
                           );
            }
            iVar3 = (*(val->super_ir_instruction)._vptr_ir_instruction[8])();
            for (swizzle._4_4_ = 0; swizzle._4_4_ < uVar2; swizzle._4_4_ = swizzle._4_4_ + 1) {
              *(uint *)(CONCAT44(extraout_var_01,iVar3) + 0x58) =
                   (unpacked_var->data).stream <<
                   (((char)(fine_location & 3) + (char)swizzle._4_4_) * '\x02' & 0x1fU) |
                   *(uint *)(CONCAT44(extraout_var_01,iVar3) + 0x58);
            }
          }
          piVar4 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
          ir_swizzle::ir_swizzle(piVar4,val,&location,uVar2);
          if (this->mode == ir_var_shader_out) {
            bitwise_assign_pack(this,(ir_rvalue *)piVar4,rvalue);
          }
          else {
            bitwise_assign_unpack(this,rvalue,(ir_rvalue *)piVar4);
          }
          this_local._4_4_ = fine_location + uVar2;
        }
        else {
          memset(right_swizzle_values + 2,0,0x10);
          memset(right_swizzle_name,0,0x10);
          memset(&i_1,0,4);
          memset(&i_2,0,4);
          left_swizzle_values[3] = 4 - (fine_location & 3);
          bVar1 = glsl_type::is_64bit(rvalue->type);
          if (bVar1) {
            left_swizzle_values[3] = left_swizzle_values[3] >> 1;
          }
          uVar2 = rvalue->type->vector_elements - left_swizzle_values[3];
          for (left_swizzle._4_4_ = 0; left_swizzle._4_4_ < left_swizzle_values[3];
              left_swizzle._4_4_ = left_swizzle._4_4_ + 1) {
            right_swizzle_values[(ulong)left_swizzle._4_4_ + 2] = left_swizzle._4_4_;
            right_swizzle_name[(ulong)left_swizzle._4_4_ - 4] = "xyzw"[left_swizzle._4_4_];
          }
          for (left_swizzle._0_4_ = 0; (uint)left_swizzle < uVar2;
              left_swizzle._0_4_ = (uint)left_swizzle + 1) {
            *(uint *)(right_swizzle_name + (ulong)(uint)left_swizzle * 4) =
                 (uint)left_swizzle + left_swizzle_values[3];
            *(char *)((long)&i_2 + (ulong)(uint)left_swizzle) =
                 "xyzw"[(uint)left_swizzle + left_swizzle_values[3]];
          }
          piVar4 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
          ir_swizzle::ir_swizzle(piVar4,rvalue,right_swizzle_values + 2,left_swizzle_values[3]);
          this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
          iVar3 = (*(rvalue->super_ir_instruction)._vptr_ir_instruction[4])(rvalue,this->mem_ctx,0);
          ir_swizzle::ir_swizzle
                    (this_01,(ir_rvalue *)CONCAT44(extraout_var_00,iVar3),(uint *)right_swizzle_name
                     ,uVar2);
          pcVar5 = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&i_1);
          swizzle_values._8_8_ = ralloc_asprintf(this->mem_ctx,"%s.%s",name,&i_2);
          if (left_swizzle_values[3] == 0) {
            unpacked_var_local._4_4_ = fine_location + 1;
          }
          else {
            unpacked_var_local._4_4_ =
                 lower_rvalue(this,(ir_rvalue *)piVar4,fine_location,unpacked_var,pcVar5,false,
                              vertex_index);
          }
          this_local._4_4_ =
               lower_rvalue(this,(ir_rvalue *)this_01,unpacked_var_local._4_4_,unpacked_var,
                            (char *)swizzle_values._8_8_,false,vertex_index);
        }
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("!gs_input_toplevel || rvalue->type->is_array()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_packed_varyings.cpp"
                ,0x20d,
                "unsigned int (anonymous namespace)::lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *, unsigned int, ir_variable *, const char *, bool, unsigned int)"
               );
}

Assistant:

unsigned
lower_packed_varyings_visitor::lower_rvalue(ir_rvalue *rvalue,
                                            unsigned fine_location,
                                            ir_variable *unpacked_var,
                                            const char *name,
                                            bool gs_input_toplevel,
                                            unsigned vertex_index)
{
   unsigned dmul = rvalue->type->is_64bit() ? 2 : 1;
   /* When gs_input_toplevel is set, we should be looking at a geometry shader
    * input array.
    */
   assert(!gs_input_toplevel || rvalue->type->is_array());

   if (rvalue->type->is_struct()) {
      for (unsigned i = 0; i < rvalue->type->length; i++) {
         if (i != 0)
            rvalue = rvalue->clone(this->mem_ctx, NULL);
         const char *field_name = rvalue->type->fields.structure[i].name;
         ir_dereference_record *dereference_record = new(this->mem_ctx)
            ir_dereference_record(rvalue, field_name);
         char *deref_name
            = ralloc_asprintf(this->mem_ctx, "%s.%s", name, field_name);
         fine_location = this->lower_rvalue(dereference_record, fine_location,
                                            unpacked_var, deref_name, false,
                                            vertex_index);
      }
      return fine_location;
   } else if (rvalue->type->is_array()) {
      /* Arrays are packed/unpacked by considering each array element in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->array_size(),
                                   fine_location, unpacked_var, name,
                                   gs_input_toplevel, vertex_index);
   } else if (rvalue->type->is_matrix()) {
      /* Matrices are packed/unpacked by considering each column vector in
       * sequence.
       */
      return this->lower_arraylike(rvalue, rvalue->type->matrix_columns,
                                   fine_location, unpacked_var, name,
                                   false, vertex_index);
   } else if (rvalue->type->vector_elements * dmul +
              fine_location % 4 > 4) {
      /* This vector is going to be "double parked" across two varying slots,
       * so handle it as two separate assignments. For doubles, a dvec3/dvec4
       * can end up being spread over 3 slots. However the second splitting
       * will happen later, here we just always want to split into 2.
       */
      unsigned left_components, right_components;
      unsigned left_swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned right_swizzle_values[4] = { 0, 0, 0, 0 };
      char left_swizzle_name[4] = { 0, 0, 0, 0 };
      char right_swizzle_name[4] = { 0, 0, 0, 0 };

      left_components = 4 - fine_location % 4;
      if (rvalue->type->is_64bit()) {
         /* We might actually end up with 0 left components! */
         left_components /= 2;
      }
      right_components = rvalue->type->vector_elements - left_components;

      for (unsigned i = 0; i < left_components; i++) {
         left_swizzle_values[i] = i;
         left_swizzle_name[i] = "xyzw"[i];
      }
      for (unsigned i = 0; i < right_components; i++) {
         right_swizzle_values[i] = i + left_components;
         right_swizzle_name[i] = "xyzw"[i + left_components];
      }
      ir_swizzle *left_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue, left_swizzle_values, left_components);
      ir_swizzle *right_swizzle = new(this->mem_ctx)
         ir_swizzle(rvalue->clone(this->mem_ctx, NULL), right_swizzle_values,
                    right_components);
      char *left_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, left_swizzle_name);
      char *right_name
         = ralloc_asprintf(this->mem_ctx, "%s.%s", name, right_swizzle_name);
      if (left_components)
         fine_location = this->lower_rvalue(left_swizzle, fine_location,
                                            unpacked_var, left_name, false,
                                            vertex_index);
      else
         /* Top up the fine location to the next slot */
         fine_location++;
      return this->lower_rvalue(right_swizzle, fine_location, unpacked_var,
                                right_name, false, vertex_index);
   } else {
      /* No special handling is necessary; pack the rvalue into the
       * varying.
       */
      unsigned swizzle_values[4] = { 0, 0, 0, 0 };
      unsigned components = rvalue->type->vector_elements * dmul;
      unsigned location = fine_location / 4;
      unsigned location_frac = fine_location % 4;
      for (unsigned i = 0; i < components; ++i)
         swizzle_values[i] = i + location_frac;
      ir_dereference *packed_deref =
         this->get_packed_varying_deref(location, unpacked_var, name,
                                        vertex_index);
      if (unpacked_var->data.stream != 0) {
         assert(unpacked_var->data.stream < 4);
         ir_variable *packed_var = packed_deref->variable_referenced();
         for (unsigned i = 0; i < components; ++i) {
            packed_var->data.stream |=
               unpacked_var->data.stream << (2 * (location_frac + i));
         }
      }
      ir_swizzle *swizzle = new(this->mem_ctx)
         ir_swizzle(packed_deref, swizzle_values, components);
      if (this->mode == ir_var_shader_out) {
         this->bitwise_assign_pack(swizzle, rvalue);
      } else {
         this->bitwise_assign_unpack(rvalue, swizzle);
      }
      return fine_location + components;
   }
}